

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExprParserHelper.cxx
# Opt level: O0

int __thiscall cmExprParserHelper::ParseString(cmExprParserHelper *this,char *str,int verb)

{
  int iVar1;
  ostream *poVar2;
  yyscan_t pvStack_30;
  int res;
  yyscan_t yyscanner;
  char *pcStack_20;
  int verb_local;
  char *str_local;
  cmExprParserHelper *this_local;
  
  if (str == (char *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    this->Verbose = verb;
    yyscanner._4_4_ = verb;
    pcStack_20 = str;
    str_local = (char *)this;
    std::__cxx11::string::operator=((string *)&this->InputBuffer,str);
    this->InputBufferPos = 0;
    this->CurrentLine = 0;
    this->Result = 0;
    cmExpr_yylex_init(&stack0xffffffffffffffd0);
    cmExpr_yyset_extra((cmListFileLexer *)this,pvStack_30);
    iVar1 = cmExpr_yyparse(pvStack_30);
    cmExpr_yylex_destroy(pvStack_30);
    if (iVar1 == 0) {
      CleanupParser(this);
      if (this->Verbose != 0) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Expanding [");
        poVar2 = std::operator<<(poVar2,pcStack_20);
        poVar2 = std::operator<<(poVar2,"] produced: [");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->Result);
        poVar2 = std::operator<<(poVar2,"]");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      this_local._4_4_ = 1;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int cmExprParserHelper::ParseString(const char* str, int verb)
{
  if (!str) {
    return 0;
  }
  // printf("Do some parsing: %s\n", str);

  this->Verbose = verb;
  this->InputBuffer = str;
  this->InputBufferPos = 0;
  this->CurrentLine = 0;

  this->Result = 0;

  yyscan_t yyscanner;
  cmExpr_yylex_init(&yyscanner);
  cmExpr_yyset_extra(this, yyscanner);
  int res = cmExpr_yyparse(yyscanner);
  cmExpr_yylex_destroy(yyscanner);
  if (res != 0) {
    // str << "CAL_Parser returned: " << res << std::endl;
    // std::cerr << "When parsing: [" << str << "]" << std::endl;
    return 0;
  }

  this->CleanupParser();

  if (Verbose) {
    std::cerr << "Expanding [" << str << "] produced: [" << this->Result << "]"
              << std::endl;
  }
  return 1;
}